

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readBoundaryTags
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  int iVar1;
  pointer pcVar2;
  pointer piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  string *__rhs;
  FILE *__stream;
  long lVar8;
  domain_error *this;
  size_type __n;
  undefined1 auVar9 [16];
  allocator_type local_99;
  int local_98;
  int nquad;
  int ntri;
  int nnodes;
  string *local_88;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_88 = filename;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + filename->_M_string_length);
  readHeader(&local_70,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __n = (size_type)(end - begin);
  local_50._M_dataplus._M_p._0_4_ = 0;
  local_98 = end;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_50,&local_99);
  __rhs = local_88;
  __stream = fopen((local_88->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,((long)begin + (long)ntri * 3 + (long)nquad * 4) * 4 + (long)nnodes * 0x18 + 0x1c
          ,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if (swapBytes && local_98 != begin) {
      lVar8 = 0;
      do {
        piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[lVar8];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)((uint)iVar1 >> 0x18) << 0x30) >> 0x28
                                                  ),CONCAT14((char)((uint)iVar1 >> 0x10),iVar1)) >>
                                                  0x20),iVar1) >> 0x18),
                                                  CONCAT12((char)((uint)iVar1 >> 8),(short)iVar1))
                                             >> 0x10),(short)iVar1) & 0xffff00ff00ff00ff;
        auVar9 = pshuflw(auVar9,auVar9,0x1b);
        sVar4 = auVar9._0_2_;
        sVar5 = auVar9._2_2_;
        sVar6 = auVar9._4_2_;
        sVar7 = auVar9._6_2_;
        piVar3[lVar8] =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar9[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar9[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar9[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar9[0] - (0xff < sVar4)))
                     );
        lVar8 = lVar8 + 1;
      } while (__n + (__n == 0) != lVar8);
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Could not open .ugrid file: ",__rhs);
  std::domain_error::domain_error(this,(string *)&local_50);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readBoundaryTags(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> tags(nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&tags[0],sizeof(int),nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < nrequested; i++) {
            bswap_32(&tags[i]);
        }
    }
    return tags;
}